

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

void luaG_traceexec(lua_State *L)

{
  Instruction **ppIVar1;
  int *piVar2;
  byte bVar3;
  CallInfo *pCVar4;
  lua_CFunction p_Var5;
  long lVar6;
  Instruction *pIVar7;
  long lVar8;
  int line;
  byte bVar9;
  int iVar10;
  char *__assertion;
  
  pCVar4 = L->ci;
  bVar3 = L->hookmask;
  piVar2 = &L->hookcount;
  *piVar2 = *piVar2 + -1;
  bVar9 = (byte)((bVar3 & 8) >> 3) & *piVar2 == 0;
  if (bVar9 == 1) {
    L->hookcount = L->basehookcount;
  }
  else if ((bVar3 & 4) == 0) {
    return;
  }
  if ((pCVar4->callstatus & 0x40) != 0) {
    pCVar4->callstatus = pCVar4->callstatus & 0xffbf;
    return;
  }
  if (bVar9 != 0) {
    luaD_hook(L,3,-1);
  }
  if ((bVar3 & 4) == 0) {
LAB_001138c7:
    L->oldpc = (pCVar4->u).l.savedpc;
    if (L->status != '\x01') {
      return;
    }
    if (bVar9 != 0) {
      L->hookcount = 1;
    }
    ppIVar1 = &(pCVar4->u).l.savedpc;
    *ppIVar1 = *ppIVar1 + -1;
    *(byte *)&pCVar4->callstatus = (byte)pCVar4->callstatus | 0x40;
    pCVar4->func = L->top + -1;
    luaD_throw(L,1);
  }
  if (pCVar4->func->tt_ == 0x8006) {
    p_Var5 = (pCVar4->func->value_).f;
    if (p_Var5[8] == (_func_int_lua_State_ptr)0x6) {
      lVar6 = *(long *)(p_Var5 + 0x18);
      pIVar7 = (pCVar4->u).l.savedpc;
      lVar8 = *(long *)(lVar6 + 0x38);
      lVar6 = *(long *)(lVar6 + 0x48);
      iVar10 = (int)((ulong)((long)pIVar7 - lVar8) >> 2) + -1;
      if (lVar6 == 0) {
        line = -1;
      }
      else {
        line = *(int *)(lVar6 + (long)iVar10 * 4);
      }
      if ((iVar10 != 0) && (L->oldpc < pIVar7)) {
        if (lVar6 == 0) {
          iVar10 = -1;
        }
        else {
          iVar10 = *(int *)(lVar6 + (((long)L->oldpc - lVar8) * 0x40000000 + -0x100000000 >> 0x20) *
                                    4);
        }
        if (line == iVar10) goto LAB_001138c7;
      }
      luaD_hook(L,2,line);
      goto LAB_001138c7;
    }
    __assertion = "((((ci)->func)->value_).gc)->tt == ((6) | ((0) << 4))";
  }
  else {
    __assertion = "(((((ci)->func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                ,0x2d5,"void luaG_traceexec(lua_State *)");
}

Assistant:

void luaG_traceexec (lua_State *L) {
  CallInfo *ci = L->ci;
  lu_byte mask = L->hookmask;
  int counthook = (--L->hookcount == 0 && (mask & LUA_MASKCOUNT));
  if (counthook)
    resethookcount(L);  /* reset count */
  else if (!(mask & LUA_MASKLINE))
    return;  /* no line hook and count != 0; nothing to be done */
  if (ci->callstatus & CIST_HOOKYIELD) {  /* called hook last time? */
    ci->callstatus &= ~CIST_HOOKYIELD;  /* erase mark */
    return;  /* do not call hook again (VM yielded, so it did not move) */
  }
  if (counthook)
    luaD_hook(L, LUA_HOOKCOUNT, -1);  /* call count hook */
  if (mask & LUA_MASKLINE) {
    Proto *p = ci_func(ci)->p;
    int npc = pcRel(ci->u.l.savedpc, p);
    int newline = getfuncline(p, npc);
    if (npc == 0 ||  /* call linehook when enter a new function, */
        ci->u.l.savedpc <= L->oldpc ||  /* when jump back (loop), or when */
        newline != getfuncline(p, pcRel(L->oldpc, p)))  /* enter a new line */
      luaD_hook(L, LUA_HOOKLINE, newline);  /* call line hook */
  }
  L->oldpc = ci->u.l.savedpc;
  if (L->status == LUA_YIELD) {  /* did hook yield? */
    if (counthook)
      L->hookcount = 1;  /* undo decrement to zero */
    ci->u.l.savedpc--;  /* undo increment (resume will increment it again) */
    ci->callstatus |= CIST_HOOKYIELD;  /* mark that it yielded */
    ci->func = L->top - 1;  /* protect stack below results */
    luaD_throw(L, LUA_YIELD);
  }
}